

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O0

void xla::BackwardDFS(Rep *r,int32_t n,int32_t lower_bound)

{
  bool bVar1;
  reference pvVar2;
  reference pvVar3;
  reference this;
  vector<int,_std::allocator<int>_> *this_00;
  reference piVar4;
  Node *nw;
  const_iterator cStack_40;
  int w;
  const_iterator __end2;
  const_iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  NodeIO *nn_io;
  Node *nn;
  int32_t lower_bound_local;
  int32_t n_local;
  Rep *r_local;
  
  nn._0_4_ = lower_bound;
  nn._4_4_ = n;
  _lower_bound_local = r;
  std::vector<int,_std::allocator<int>_>::clear(&r->deltab_);
  std::vector<int,_std::allocator<int>_>::clear(&_lower_bound_local->stack_);
  std::vector<int,_std::allocator<int>_>::push_back
            (&_lower_bound_local->stack_,(value_type_conflict1 *)((long)&nn + 4));
  while (bVar1 = std::vector<int,_std::allocator<int>_>::empty(&_lower_bound_local->stack_),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::back(&_lower_bound_local->stack_);
    nn._4_4_ = *pvVar2;
    std::vector<int,_std::allocator<int>_>::pop_back(&_lower_bound_local->stack_);
    pvVar3 = std::
             vector<xla::(anonymous_namespace)::Node,_std::allocator<xla::(anonymous_namespace)::Node>_>
             ::operator[](&_lower_bound_local->nodes_,(long)nn._4_4_);
    if ((pvVar3->visited & 1U) == 0) {
      pvVar3->visited = true;
      std::vector<int,_std::allocator<int>_>::push_back
                (&_lower_bound_local->deltab_,(value_type_conflict1 *)((long)&nn + 4));
      this = std::
             vector<xla::(anonymous_namespace)::NodeIO,_std::allocator<xla::(anonymous_namespace)::NodeIO>_>
             ::operator[](&_lower_bound_local->node_io_,(long)nn._4_4_);
      this_00 = OrderedSet<int>::GetSequence(&this->in);
      __end2 = std::vector<int,_std::allocator<int>_>::begin(this_00);
      cStack_40 = std::vector<int,_std::allocator<int>_>::end(this_00);
      while (bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffffc0), bVar1) {
        piVar4 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                 ::operator*(&__end2);
        nw._4_4_ = *piVar4;
        pvVar3 = std::
                 vector<xla::(anonymous_namespace)::Node,_std::allocator<xla::(anonymous_namespace)::Node>_>
                 ::operator[](&_lower_bound_local->nodes_,(long)nw._4_4_);
        if (((pvVar3->visited & 1U) == 0) && ((int32_t)nn < pvVar3->rank)) {
          std::vector<int,_std::allocator<int>_>::push_back
                    (&_lower_bound_local->stack_,(value_type_conflict1 *)((long)&nw + 4));
        }
        __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
        operator++(&__end2);
      }
    }
  }
  return;
}

Assistant:

static void BackwardDFS(GraphCycles::Rep* r, int32_t n, int32_t lower_bound) {
  r->deltab_.clear();
  r->stack_.clear();
  r->stack_.push_back(n);
  while (!r->stack_.empty()) {
    n = r->stack_.back();
    r->stack_.pop_back();
    Node* nn = &r->nodes_[n];
    if (nn->visited) continue;

    nn->visited = true;
    r->deltab_.push_back(n);

    NodeIO* nn_io = &r->node_io_[n];
    for (auto w : nn_io->in.GetSequence()) {
      Node* nw = &r->nodes_[w];
      if (!nw->visited && lower_bound < nw->rank) {
        r->stack_.push_back(w);
      }
    }
  }
}